

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullFormatter.h
# Opt level: O1

string * __thiscall
SLogLib::NullFormatter::formatMessage_abi_cxx11_
          (string *__return_storage_ptr__,NullFormatter *this,Message *msg)

{
  ostream *poVar1;
  ostringstream _stream;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if ((this->super_AbstractFormatter).mNewLine == Yes) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,*(char **)msg,*(long *)(msg + 8));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)msg,*(long *)(msg + 8) + *(long *)msg);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string formatMessage(const Message& msg) const override
	{
		if(mNewLine == NewLine::Yes)
		{
			std::ostringstream _stream;
			_stream << msg.mUserMessage << std::endl;
			return _stream.str();
		}
		else
		{
			return msg.mUserMessage;
		}
	}